

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerHLSL::emit_builtin_variables(CompilerHLSL *this)

{
  BaseType *ts_1;
  string local_140;
  string local_120;
  undefined1 local_100 [8];
  string binding_info;
  anon_class_32_4_e8ece2ac local_c0;
  BaseType local_a0 [2];
  BaseType sample_mask_out_basetype;
  BaseType sample_mask_in_basetype;
  unordered_map<unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)0>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>_>
  builtin_to_initializer;
  undefined1 local_50 [8];
  Bitset builtins;
  CompilerHLSL *this_local;
  
  builtins.higher._M_h._M_single_bucket = (__node_base_ptr)this;
  Bitset::Bitset((Bitset *)local_50,&(this->super_CompilerGLSL).super_Compiler.active_input_builtins
                );
  Bitset::merge_or((Bitset *)local_50,
                   &(this->super_CompilerGLSL).super_Compiler.active_output_builtins);
  ::std::
  unordered_map<unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)0>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>_>
  ::unordered_map((unordered_map<unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)0>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>_>
                   *)&sample_mask_out_basetype);
  local_a0[1] = 1;
  local_a0[0] = Void;
  local_c0.sample_mask_in_basetype = local_a0 + 1;
  local_c0.sample_mask_out_basetype = local_a0;
  local_c0.this = this;
  local_c0.builtin_to_initializer =
       (unordered_map<unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)0>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>_>
        *)&sample_mask_out_basetype;
  ParsedIR::
  for_each_typed_id<spirv_cross::SPIRVariable,spirv_cross::CompilerHLSL::emit_builtin_variables()::__0>
            (&(this->super_CompilerGLSL).super_Compiler.ir,&local_c0);
  ts_1 = &sample_mask_out_basetype;
  binding_info.field_2._8_8_ = ts_1;
  Bitset::for_each_bit<spirv_cross::CompilerHLSL::emit_builtin_variables()::__1>
            ((Bitset *)local_50,(anon_class_32_4_fdb8fe48 *)((long)&binding_info.field_2 + 8));
  if ((((this->base_vertex_info).used & 1U) != 0) && ((this->hlsl_options).shader_model < 0x44)) {
    ::std::__cxx11::string::string((string *)local_100);
    if (((this->base_vertex_info).explicit_binding & 1U) != 0) {
      join<char_const(&)[14],unsigned_int&>
                (&local_120,(spirv_cross *)" : register(b",(char (*) [14])&this->base_vertex_info,
                 ts_1);
      ::std::__cxx11::string::operator=((string *)local_100,(string *)&local_120);
      ::std::__cxx11::string::~string((string *)&local_120);
      if ((this->base_vertex_info).register_space != 0) {
        join<char_const(&)[8],unsigned_int&>
                  (&local_140,(spirv_cross *)", space",
                   (char (*) [8])&(this->base_vertex_info).register_space,ts_1);
        ::std::__cxx11::string::operator+=((string *)local_100,(string *)&local_140);
        ::std::__cxx11::string::~string((string *)&local_140);
      }
      ::std::__cxx11::string::operator+=((string *)local_100,")");
    }
    CompilerGLSL::statement<char_const(&)[31],std::__cxx11::string&>
              (&this->super_CompilerGLSL,(char (*) [31])"cbuffer SPIRV_Cross_VertexInfo",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100);
    CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
    CompilerGLSL::statement<char_const(&)[28]>(&this->super_CompilerGLSL,(char (*) [28])0x5b86f5);
    CompilerGLSL::statement<char_const(&)[30]>(&this->super_CompilerGLSL,(char (*) [30])0x5b869f);
    CompilerGLSL::end_scope_decl(&this->super_CompilerGLSL);
    CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x563e71);
    ::std::__cxx11::string::~string((string *)local_100);
  }
  ::std::
  unordered_map<unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)0>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>_>
  ::~unordered_map((unordered_map<unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)0>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>_>
                    *)&sample_mask_out_basetype);
  Bitset::~Bitset((Bitset *)local_50);
  return;
}

Assistant:

void CompilerHLSL::emit_builtin_variables()
{
	Bitset builtins = active_input_builtins;
	builtins.merge_or(active_output_builtins);

	std::unordered_map<uint32_t, ID> builtin_to_initializer;

	// We need to declare sample mask with the same type that module declares it.
	// Sample mask is somewhat special in that SPIR-V has an array, and we can copy that array, so we need to
	// match sign.
	SPIRType::BaseType sample_mask_in_basetype = SPIRType::Void;
	SPIRType::BaseType sample_mask_out_basetype = SPIRType::Void;

	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
		if (!is_builtin_variable(var))
			return;

		auto &type = this->get<SPIRType>(var.basetype);
		auto builtin = BuiltIn(get_decoration(var.self, DecorationBuiltIn));

		if (var.storage == StorageClassInput && builtin == BuiltInSampleMask)
			sample_mask_in_basetype = type.basetype;
		else if (var.storage == StorageClassOutput && builtin == BuiltInSampleMask)
			sample_mask_out_basetype = type.basetype;

		if (var.initializer && var.storage == StorageClassOutput)
		{
			auto *c = this->maybe_get<SPIRConstant>(var.initializer);
			if (!c)
				return;

			if (type.basetype == SPIRType::Struct)
			{
				uint32_t member_count = uint32_t(type.member_types.size());
				for (uint32_t i = 0; i < member_count; i++)
				{
					if (has_member_decoration(type.self, i, DecorationBuiltIn))
					{
						builtin_to_initializer[get_member_decoration(type.self, i, DecorationBuiltIn)] =
								c->subconstants[i];
					}
				}
			}
			else if (has_decoration(var.self, DecorationBuiltIn))
			{
				builtin_to_initializer[builtin] = var.initializer;
			}
		}
	});

	// Emit global variables for the interface variables which are statically used by the shader.
	builtins.for_each_bit([&](uint32_t i) {
		const char *type = nullptr;
		auto builtin = static_cast<BuiltIn>(i);
		uint32_t array_size = 0;

		string init_expr;
		auto init_itr = builtin_to_initializer.find(builtin);
		if (init_itr != builtin_to_initializer.end())
			init_expr = join(" = ", to_expression(init_itr->second));

		if (get_execution_model() == ExecutionModelMeshEXT)
		{
			if (builtin == BuiltInPosition || builtin == BuiltInPointSize || builtin == BuiltInClipDistance ||
			    builtin == BuiltInCullDistance || builtin == BuiltInLayer || builtin == BuiltInPrimitiveId ||
			    builtin == BuiltInViewportIndex || builtin == BuiltInCullPrimitiveEXT ||
			    builtin == BuiltInPrimitiveShadingRateKHR || builtin == BuiltInPrimitivePointIndicesEXT ||
			    builtin == BuiltInPrimitiveLineIndicesEXT || builtin == BuiltInPrimitiveTriangleIndicesEXT)
			{
				return;
			}
		}

		switch (builtin)
		{
		case BuiltInFragCoord:
		case BuiltInPosition:
			type = "float4";
			break;

		case BuiltInFragDepth:
			type = "float";
			break;

		case BuiltInVertexId:
		case BuiltInVertexIndex:
		case BuiltInInstanceIndex:
			type = "int";
			if (hlsl_options.support_nonzero_base_vertex_base_instance || hlsl_options.shader_model >= 68)
				base_vertex_info.used = true;
			break;

		case BuiltInBaseVertex:
		case BuiltInBaseInstance:
			type = "int";
			base_vertex_info.used = true;
			break;

		case BuiltInInstanceId:
		case BuiltInSampleId:
			type = "int";
			break;

		case BuiltInPointSize:
			if (hlsl_options.point_size_compat || hlsl_options.shader_model <= 30)
			{
				// Just emit the global variable, it will be ignored.
				type = "float";
				break;
			}
			else
				SPIRV_CROSS_THROW(join("Unsupported builtin in HLSL: ", unsigned(builtin)));

		case BuiltInGlobalInvocationId:
		case BuiltInLocalInvocationId:
		case BuiltInWorkgroupId:
			type = "uint3";
			break;

		case BuiltInLocalInvocationIndex:
			type = "uint";
			break;

		case BuiltInFrontFacing:
			type = "bool";
			break;

		case BuiltInNumWorkgroups:
		case BuiltInPointCoord:
			// Handled specially.
			break;

		case BuiltInSubgroupLocalInvocationId:
		case BuiltInSubgroupSize:
			if (hlsl_options.shader_model < 60)
				SPIRV_CROSS_THROW("Need SM 6.0 for Wave ops.");
			break;

		case BuiltInSubgroupEqMask:
		case BuiltInSubgroupLtMask:
		case BuiltInSubgroupLeMask:
		case BuiltInSubgroupGtMask:
		case BuiltInSubgroupGeMask:
			if (hlsl_options.shader_model < 60)
				SPIRV_CROSS_THROW("Need SM 6.0 for Wave ops.");
			type = "uint4";
			break;

		case BuiltInHelperInvocation:
			if (hlsl_options.shader_model < 50)
				SPIRV_CROSS_THROW("Need SM 5.0 for Helper Invocation.");
			break;

		case BuiltInClipDistance:
			array_size = clip_distance_count;
			type = "float";
			break;

		case BuiltInCullDistance:
			array_size = cull_distance_count;
			type = "float";
			break;

		case BuiltInSampleMask:
			if (active_input_builtins.get(BuiltInSampleMask))
				type = sample_mask_in_basetype == SPIRType::UInt ? "uint" : "int";
			else
				type = sample_mask_out_basetype == SPIRType::UInt ? "uint" : "int";
			array_size = 1;
			break;

		case BuiltInPrimitiveId:
		case BuiltInViewIndex:
		case BuiltInLayer:
			type = "uint";
			break;

		case BuiltInViewportIndex:
		case BuiltInPrimitiveShadingRateKHR:
		case BuiltInPrimitiveLineIndicesEXT:
		case BuiltInCullPrimitiveEXT:
			type = "uint";
			break;

		case BuiltInBaryCoordKHR:
		case BuiltInBaryCoordNoPerspKHR:
			if (hlsl_options.shader_model < 61)
				SPIRV_CROSS_THROW("Need SM 6.1 for barycentrics.");
			type = "float3";
			break;

		default:
			SPIRV_CROSS_THROW(join("Unsupported builtin in HLSL: ", unsigned(builtin)));
		}

		StorageClass storage = active_input_builtins.get(i) ? StorageClassInput : StorageClassOutput;

		if (type)
		{
			if (array_size)
				statement("static ", type, " ", builtin_to_glsl(builtin, storage), "[", array_size, "]", init_expr, ";");
			else
				statement("static ", type, " ", builtin_to_glsl(builtin, storage), init_expr, ";");
		}

		// SampleMask can be both in and out with sample builtin, in this case we have already
		// declared the input variable and we need to add the output one now.
		if (builtin == BuiltInSampleMask && storage == StorageClassInput && this->active_output_builtins.get(i))
		{
			type = sample_mask_out_basetype == SPIRType::UInt ? "uint" : "int";
			if (array_size)
				statement("static ", type, " ", this->builtin_to_glsl(builtin, StorageClassOutput), "[", array_size, "]", init_expr, ";");
			else
				statement("static ", type, " ", this->builtin_to_glsl(builtin, StorageClassOutput), init_expr, ";");
		}
	});

	if (base_vertex_info.used && hlsl_options.shader_model < 68)
	{
		string binding_info;
		if (base_vertex_info.explicit_binding)
		{
			binding_info = join(" : register(b", base_vertex_info.register_index);
			if (base_vertex_info.register_space)
				binding_info += join(", space", base_vertex_info.register_space);
			binding_info += ")";
		}
		statement("cbuffer SPIRV_Cross_VertexInfo", binding_info);
		begin_scope();
		statement("int SPIRV_Cross_BaseVertex;");
		statement("int SPIRV_Cross_BaseInstance;");
		end_scope_decl();
		statement("");
	}
}